

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image *
rf_gen_image_cellular_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,int tile_size,rf_rand_proc rand,
          rf_color *dst,rf_int dst_size)

{
  double dVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  rf_int rVar9;
  rf_int rVar10;
  long lVar11;
  rf_int j;
  int iVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  long local_d0;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  iVar12 = width / tile_size;
  if (width * height * 4 <= dst_size) {
    if (0 < height) {
      local_d0 = 0;
      do {
        if (0 < width) {
          iVar3 = (int)(local_d0 / (long)tile_size);
          lVar5 = local_d0 * width;
          lVar11 = 0;
          do {
            iVar4 = (int)(lVar11 / (long)tile_size);
            iVar13 = (iVar3 + -1) * iVar12 + -1 + iVar4;
            lVar6 = -1;
            fVar17 = INFINITY;
            do {
              lVar7 = lVar6 + iVar4;
              if (lVar7 < iVar12 && -1 < lVar7) {
                lVar7 = -1;
                iVar14 = iVar13;
                do {
                  lVar8 = iVar3 + lVar7;
                  if ((-1 < lVar8) && (lVar8 < height / tile_size)) {
                    rVar9 = (*rand)(0,(long)(tile_size + -1));
                    rVar10 = (*rand)(0,(long)(tile_size + -1));
                    dVar1 = hypot((double)(lVar11 - (int)(float)((int)rVar10 +
                                                                (iVar14 % iVar12) * tile_size)),
                                  (double)(local_d0 -
                                          (int)(float)((int)rVar9 + (iVar14 / iVar12) * tile_size)))
                    ;
                    fVar15 = (float)dVar1;
                    fVar16 = fVar15;
                    if (fVar17 <= fVar15) {
                      fVar16 = fVar17;
                    }
                    fVar17 = (float)(~-(uint)NAN(fVar17) & (uint)fVar16 |
                                    -(uint)NAN(fVar17) & (uint)fVar15);
                  }
                  lVar7 = lVar7 + 1;
                  iVar14 = iVar14 + iVar12;
                } while (lVar7 != 2);
              }
              lVar6 = lVar6 + 1;
              iVar13 = iVar13 + 1;
            } while (lVar6 != 2);
            iVar4 = (int)((fVar17 * 256.0) / (float)tile_size);
            uVar2 = (uchar)iVar4;
            if (0xfe < iVar4) {
              uVar2 = 0xff;
            }
            dst[lVar5 + lVar11].r = uVar2;
            dst[lVar5 + lVar11].g = uVar2;
            dst[lVar5 + lVar11].b = uVar2;
            dst[lVar5 + lVar11].a = 0xff;
            lVar11 = lVar11 + 1;
          } while (lVar11 != width);
        }
        local_d0 = local_d0 + 1;
      } while (local_d0 != height);
    }
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_cellular_to_buffer(int width, int height, int tile_size, rf_rand_proc rand, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    int seeds_per_row = width / tile_size;
    int seeds_per_col = height / tile_size;
    int seeds_count = seeds_per_row * seeds_per_col;

    if (dst_size >= width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8))
    {
        for (rf_int y = 0; y < height; y++)
        {
            int tile_y = y / tile_size;

            for (rf_int x = 0; x < width; x++)
            {
                int tile_x = x / tile_size;

                float min_distance = INFINITY;

                // Check all adjacent tiles
                for (rf_int i = -1; i < 2; i++)
                {
                    if ((tile_x + i < 0) || (tile_x + i >= seeds_per_row)) continue;

                    for (rf_int j = -1; j < 2; j++)
                    {
                        if ((tile_y + j < 0) || (tile_y + j >= seeds_per_col)) continue;

                        rf_vec2 neighbor_seed = rf_get_seed_for_cellular_image(seeds_per_row, tile_size, (tile_y + j) * seeds_per_row + tile_x + i, rand);

                        float dist = (float)hypot(x - (int)neighbor_seed.x, y - (int)neighbor_seed.y);
                        min_distance = (float)fmin(min_distance, dist);
                    }
                }

                // I made this up but it seems to give good results at all tile sizes
                int intensity = (int)(min_distance * 256.0f / tile_size);
                if (intensity > 255) intensity = 255;

                dst[y * width + x] = (rf_color) { intensity, intensity, intensity, 255 };
            }
        }

        result = (rf_image)
        {
            .data = dst,
            .width = width,
            .height = height,
            .format = RF_UNCOMPRESSED_R8G8B8A8,
            .valid = true,
        };
    }

    return result;
}